

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O3

void * crnlib::task_pool::thread_func(void *pContext)

{
  uint64 *puVar1;
  undefined8 *puVar2;
  uint64 uVar3;
  char cVar4;
  __pid_t _Var5;
  uint uVar6;
  long lVar7;
  task tStack_48;
  
  _Var5 = semaphore::wait((semaphore *)((long)pContext + 0xa18),(void *)0xffffffff);
  cVar4 = (char)_Var5;
  while( true ) {
    if (cVar4 == '\0') {
      return (void *)0x0;
    }
    if (*(long *)((long)pContext + 0xa68) != 0) break;
    spinlock::lock((spinlock *)pContext);
    if (*(int *)((long)pContext + 0x808) < 1) {
      spinlock::unlock((spinlock *)pContext);
    }
    else {
      uVar6 = *(int *)((long)pContext + 0x808) - 1;
      *(uint *)((long)pContext + 0x808) = uVar6;
      lVar7 = (ulong)uVar6 * 0x20;
      puVar1 = (uint64 *)((long)pContext + lVar7 + 8);
      tStack_48.m_data = *puVar1;
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)pContext + lVar7 + 0x14);
      tStack_48._20_8_ = puVar2[1];
      tStack_48.field_2._0_4_ = (undefined4)((ulong)*puVar2 >> 0x20);
      tStack_48.m_pData_ptr._0_4_ = (undefined4)uVar3;
      tStack_48.m_pData_ptr._4_4_ = (undefined4)(uVar3 >> 0x20);
      spinlock::unlock((spinlock *)pContext);
      process_task((task_pool *)pContext,&tStack_48);
    }
    _Var5 = semaphore::wait((semaphore *)((long)pContext + 0xa18),(void *)0xffffffff);
    cVar4 = (char)_Var5;
  }
  return (void *)0x0;
}

Assistant:

void* task_pool::thread_func(void* pContext) {
  task_pool* pPool = static_cast<task_pool*>(pContext);
  task tsk;

  for (;;) {
    if (!pPool->m_tasks_available.wait())
      break;

    if (pPool->m_exit_flag)
      break;

    if (pPool->m_task_stack.pop(tsk)) {
      pPool->process_task(tsk);
    }
  }

  return NULL;
}